

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

LocalTime * Time::toLocal(LocalTime *__return_storage_ptr__,Time *time)

{
  long second;
  long usecond;
  Time *time_local;
  
  second = Time::Second(time);
  usecond = Time::microSecond(time);
  LocalTime::LocalTime(__return_storage_ptr__,second,usecond);
  return __return_storage_ptr__;
}

Assistant:

LocalTime toLocal(const Time & time)
    {
/*        struct tm tmt;
        makeLocalTime((time_t)time.Second(), tmt);
        return LocalTime(timeGM(&tmt), time.microSecond());*/
        return LocalTime(time.Second(), time.microSecond());
    }